

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

void __thiscall
asio::detail::
read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
::operator()(read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  bool bVar1;
  cancellation_type_t cVar2;
  size_t sVar3;
  error_code *__args;
  size_t in_RCX;
  consuming_single_buffer<asio::mutable_buffers_1> *in_RDI;
  int in_R8D;
  size_t max_size;
  size_t in_stack_ffffffffffffff98;
  read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
  *in_stack_ffffffffffffffa0;
  mutable_buffers_1 *buffers;
  undefined8 in_stack_ffffffffffffffb8;
  basic_errors __e;
  _Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>
  *in_stack_ffffffffffffffc0;
  error_code local_10;
  
  __e = (basic_errors)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  *(int *)&in_RDI[1].buffer_.super_mutable_buffer.size_ = in_R8D;
  if (in_R8D == 1) {
    consuming_single_buffer<asio::mutable_buffers_1>::total_consumed
              ((consuming_single_buffer<asio::mutable_buffers_1> *)
               &(in_RDI->buffer_).super_mutable_buffer.size_);
    base_from_completion_cond<asio::detail::transfer_all_t>::check_for_completion
              ((error_code *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
LAB_001fef44:
    buffers = (mutable_buffers_1 *)(in_RDI->buffer_).super_mutable_buffer.data_;
    consuming_single_buffer<asio::mutable_buffers_1>::prepare(in_RDI,(size_t)buffers);
    basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::
    async_read_some<asio::mutable_buffers_1,asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>>
              ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_RDI,buffers,
               in_stack_ffffffffffffffa0);
  }
  else {
    consuming_single_buffer<asio::mutable_buffers_1>::consume
              ((consuming_single_buffer<asio::mutable_buffers_1> *)
               &(in_RDI->buffer_).super_mutable_buffer.size_,in_RCX);
    bVar1 = std::error_code::operator_cast_to_bool(&local_10);
    if (((bVar1) || (in_RCX != 0)) &&
       (bVar1 = consuming_single_buffer<asio::mutable_buffers_1>::empty
                          ((consuming_single_buffer<asio::mutable_buffers_1> *)
                           in_stack_ffffffffffffffa0), !bVar1)) {
      consuming_single_buffer<asio::mutable_buffers_1>::total_consumed
                ((consuming_single_buffer<asio::mutable_buffers_1> *)
                 &(in_RDI->buffer_).super_mutable_buffer.size_);
      sVar3 = base_from_completion_cond<asio::detail::transfer_all_t>::check_for_completion
                        ((error_code *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (sVar3 != 0) {
        cVar2 = base_from_cancellation_state<std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>,_void>
                ::cancelled((base_from_cancellation_state<std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>,_void>
                             *)in_RDI);
        if (cVar2 == none) goto LAB_001fef44;
        std::error_code::operator=((error_code *)in_stack_ffffffffffffffc0,__e);
      }
    }
    __args = (error_code *)
             consuming_single_buffer<asio::mutable_buffers_1>::total_consumed
                       ((consuming_single_buffer<asio::mutable_buffers_1> *)
                        &(in_RDI->buffer_).super_mutable_buffer.size_);
    std::
    _Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>
    ::operator()(in_stack_ffffffffffffffc0,__args,(unsigned_long *)in_RDI);
  }
  return;
}

Assistant:

void operator()(asio::error_code ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        for (;;)
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_read"));
            stream_.async_read_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(read_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
          if (max_size == 0)
            break;
          if (this->cancelled() != cancellation_type::none)
          {
            ec = error::operation_aborted;
            break;
          }
        }

        ASIO_MOVE_OR_LVALUE(ReadHandler)(handler_)(
            static_cast<const asio::error_code&>(ec),
            static_cast<const std::size_t&>(buffers_.total_consumed()));
      }
    }